

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

string * duckdb::FormatOptionLine<duckdb::StrpTimeFormat>
                   (string *__return_storage_ptr__,string *name,
                   CSVOption<duckdb::StrpTimeFormat> *option)

{
  undefined8 *puVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  pcVar2 = (name->_M_dataplus)._M_p;
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + name->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_88);
  pcVar2 = (option->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,
             pcVar2 + (option->value).super_StrTimeFormat.format_specifier._M_string_length);
  uVar8 = 0xf;
  if (local_88 != local_78) {
    uVar8 = local_78[0];
  }
  if (uVar8 < (ulong)(local_40 + local_80)) {
    uVar8 = 0xf;
    if (local_48 != local_38) {
      uVar8 = local_38[0];
    }
    if (uVar8 < (ulong)(local_40 + local_80)) goto LAB_00bafa62;
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_00bafa62:
    puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48);
  }
  local_e8 = &local_d8;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_d8 = *puVar1;
    uStack_d0 = puVar4[3];
  }
  else {
    local_d8 = *puVar1;
    local_e8 = (undefined8 *)*puVar4;
  }
  local_e0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_e8);
  puVar6 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar6) {
    local_98 = *puVar6;
    lStack_90 = plVar5[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar6;
    local_a8 = (ulong *)*plVar5;
  }
  local_a0 = plVar5[1];
  *plVar5 = (long)puVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  CSVOption<duckdb::StrpTimeFormat>::FormatSet_abi_cxx11_(&local_68,option);
  uVar8 = 0xf;
  if (local_a8 != &local_98) {
    uVar8 = local_98;
  }
  if (uVar8 < local_68._M_string_length + local_a0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar9 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_a0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00bafb99;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
LAB_00bafb99:
  local_c8 = &local_b8;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = puVar4[3];
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (undefined8 *)*puVar4;
  }
  local_c0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatOptionLine(const string &name, const CSVOption<T> &option) {
	return name + " = " + option.FormatValue() + " " + option.FormatSet() + "\n  ";
}